

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core-as.c
# Opt level: O3

matches * catmatches(matches *a,matches *b)

{
  int iVar1;
  match *__ptr;
  int iVar2;
  long lVar3;
  long lVar4;
  
  if (0 < b->mnum) {
    lVar4 = 0;
    lVar3 = 0;
    do {
      iVar2 = a->mnum;
      iVar1 = a->mmax;
      __ptr = a->m;
      if (iVar1 <= iVar2) {
        iVar2 = iVar1 * 2;
        if (iVar1 == 0) {
          iVar2 = 0x10;
        }
        a->mmax = iVar2;
        __ptr = (match *)realloc(__ptr,(long)iVar2 * 0xb8);
        a->m = __ptr;
        iVar2 = a->mnum;
      }
      a->mnum = iVar2 + 1;
      memcpy(__ptr + iVar2,(void *)((long)b->m->a + lVar4 + -8),0xb8);
      lVar3 = lVar3 + 1;
      lVar4 = lVar4 + 0xb8;
    } while (lVar3 < b->mnum);
  }
  free(b->m);
  free(b);
  return a;
}

Assistant:

struct matches *catmatches(struct matches *a, struct matches *b) {
	int i;
	for (i = 0; i < b->mnum; i++)
		ADDARRAY(a->m, b->m[i]);
	free(b->m);
	free(b);
	return a;
}